

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O1

int memory_read(mtar_t *tar,void *data,size_t size)

{
  int iVar1;
  
  iVar1 = 0;
  if (size != 0) {
    iVar1 = -3;
    if (size + tar->memory_pos <= tar->memory_size) {
      memcpy(data,(void *)(tar->memory_pos + (long)tar->stream),size);
      tar->memory_pos = tar->memory_pos + size;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int memory_read(mtar_t *tar, void *data, size_t size) {
  char *memory;

  if (!size)
    return MTAR_ESUCCESS;

  memory = (char *)tar->stream;
  if (tar->memory_pos + size > tar->memory_size)
    return MTAR_EREADFAIL;

  memcpy(data, &memory[tar->memory_pos], size);
  tar->memory_pos += size;

  return MTAR_ESUCCESS;
}